

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.h
# Opt level: O1

bool __thiscall
LinearScan::GeneratorBailIn::NeedsReloadingSymWhenBailingIn(GeneratorBailIn *this,StackSym *sym)

{
  StackSym *pSVar1;
  bool bVar2;
  byte bVar3;
  RegSlot i;
  
  if ((*(uint *)&sym->field_0x18 >> 0x12 & 1) == 0) {
    if ((*(uint *)&sym->field_0x18 >> 0xd & 1) == 0) {
      pSVar1 = this->func->m_generatorFrameSym;
      if ((pSVar1 == (StackSym *)0x0) || ((pSVar1->super_Sym).m_id != (sym->super_Sym).m_id)) {
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = StackSym::IsConst(sym);
      if (bVar2) {
        bVar3 = *(byte *)((long)sym->scratch + 0x9c) & 1;
      }
      else {
        i = StackSym::GetByteCodeRegSlot(sym);
        bVar3 = BVSparse<Memory::JitArenaAllocator>::Test(&this->initializedRegs,i);
      }
      bVar2 = bVar3 == 0;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool            IsFromByteCodeConstantTable() const { return m_isFromByteCodeConstantTable; }